

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  server_t s;
  string local_3a8;
  undefined8 local_388;
  undefined8 uStack_380;
  code *local_378;
  undefined8 uStack_370;
  _Any_data local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  _Any_data local_328;
  code *local_318;
  undefined8 uStack_310;
  server_t local_300;
  
  clask::server_t::server_t(&local_300);
  paVar1 = &local_3a8.field_2;
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"/api","");
  local_388 = 0;
  uStack_380 = 0;
  local_348._M_unused._M_object = (void *)0x0;
  local_348._8_8_ = 0;
  local_358._M_allocated_capacity = 0;
  local_358._8_8_ = 0;
  local_368._M_unused._M_object = (void *)0x0;
  local_368._8_8_ = 0;
  local_330 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/main.cxx:7:17)>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/main.cxx:7:17)>
              ::_M_manager;
  local_378 = (code *)0x0;
  uStack_370 = 0;
  local_328._M_unused._M_object = (void *)0x0;
  local_328._8_8_ = 0;
  local_318 = (code *)0x0;
  uStack_310 = 0;
  clask::server_t::parse_tree(&local_300,&local_300.treeGET,&local_3a8,(func_t *)&local_368);
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,__destroy_functor);
  }
  if (local_338 != (code *)0x0) {
    (*local_338)(&local_348,&local_348,__destroy_functor);
  }
  if ((code *)local_358._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_358._M_allocated_capacity)(&local_368,&local_368,3);
  }
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_368._M_unused._M_object = &local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"/","");
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"./public","");
  clask::server_t::static_dir(&local_300,(string *)&local_368,&local_3a8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_unused._0_8_ != &local_358) {
    operator_delete(local_368._M_unused._M_object,(ulong)(local_358._M_allocated_capacity + 1));
  }
  local_368._8_8_ = 0;
  local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
  local_368._M_unused._M_object = &local_358;
  clask::server_t::_run(&local_300,(string *)&local_368,0x1f90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_unused._0_8_ != &local_358) {
    operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
  }
  clask::server_t::~server_t(&local_300);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();

  s.GET("/api", [&](clask::request&) {
      nlohmann::json data;
      data["user"][0]["id"] = 1;
      data["user"][0]["name"] = "mattn";
      data["user"][0]["created_at"] = "2020/06/14 00:41:35";
      data["user"][1]["id"] = 2;
      data["user"][1]["name"] = "gopher";
      data["user"][1]["created_at"] = "2020/06/12 15:07:54";
      return data.dump();
  });
  s.static_dir("/", "./public");
  s.run();
}